

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::string_container_write_variable
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype,string *base_var)

{
  bool bVar1;
  bool bVar2;
  t_rs_generator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (t_rs_generator *)__return_storage_ptr__;
  bVar1 = needs_deref_on_container_write((t_rs_generator *)__return_storage_ptr__,ttype);
  bVar2 = is_double(this_00,ttype);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((bVar1) && (bVar2)) {
    std::operator+(&local_60,"(*",base_var);
    std::operator+(&local_40,&local_60,")");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_01 = &local_60;
  }
  else {
    if (!bVar1) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_40,"*",base_var);
    this_01 = &local_40;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_01);
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::string_container_write_variable(t_type* ttype, const string& base_var) {
  bool type_needs_deref = needs_deref_on_container_write(ttype);
  bool type_is_double = is_double(ttype);

  string write_variable;

  if (type_is_double && type_needs_deref) {
    write_variable = "(*" + base_var + ")";
  } else if (type_needs_deref) {
    write_variable = "*" + base_var;
  } else {
    write_variable = base_var;
  }

  return write_variable;
}